

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::remove_subcommand(App *this,App *subcom)

{
  pointer psVar1;
  shared_ptr<CLI::App> *psVar2;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  __position;
  App_p *sub;
  pointer psVar3;
  
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    remove_excludes((psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,subcom
                   );
    remove_needs((psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,subcom);
  }
  __position = ::std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<CLI::App>*,std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::remove_subcommand(CLI::App*)::_lambda(std::shared_ptr<CLI::App>const&)_1_>>
                         ((this->subcommands_).
                          super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->subcommands_).
                          super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,subcom);
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != psVar2) {
    std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::erase
              (&this->subcommands_,(const_iterator)__position._M_current);
  }
  return __position._M_current != psVar2;
}

Assistant:

CLI11_INLINE bool App::remove_subcommand(App *subcom) {
    // Make sure no links exist
    for(App_p &sub : subcommands_) {
        sub->remove_excludes(subcom);
        sub->remove_needs(subcom);
    }

    auto iterator = std::find_if(
        std::begin(subcommands_), std::end(subcommands_), [subcom](const App_p &v) { return v.get() == subcom; });
    if(iterator != std::end(subcommands_)) {
        subcommands_.erase(iterator);
        return true;
    }
    return false;
}